

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O1

Animation * rw::Animation::streamReadLegacy(Stream *stream)

{
  void *pvVar1;
  int32 iVar2;
  int32 flags;
  long lVar3;
  Animation *pAVar4;
  AnimInterpolatorInfo *interpInfo;
  void *data;
  float32 fVar5;
  
  lVar3 = 0;
  do {
    interpInfo = *(AnimInterpolatorInfo **)((long)&interpInfoList + lVar3);
    if ((interpInfo != (AnimInterpolatorInfo *)0x0) && (interpInfo->id == 1)) goto LAB_001060ff;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x50);
  interpInfo = (AnimInterpolatorInfo *)0x0;
LAB_001060ff:
  iVar2 = Stream::readI32(stream);
  flags = Stream::readI32(stream);
  fVar5 = Stream::readF32(stream);
  pAVar4 = create(interpInfo,iVar2,flags,(float)fVar5);
  if (0 < pAVar4->numFrames) {
    pvVar1 = pAVar4->keyframes;
    data = (void *)((long)pvVar1 + 0x1c);
    lVar3 = 0;
    do {
      Stream::read32(stream,(void *)((long)data + -0x10),0x10);
      *(ulong *)((long)data + -0x10) = *(ulong *)((long)data + -0x10) ^ 0x8000000080000000;
      *(ulong *)((long)data + -8) = *(ulong *)((long)data + -8) ^ 0x80000000;
      Stream::read32(stream,data,0xc);
      fVar5 = Stream::readF32(stream);
      *(float32 *)((long)data + -0x14) = fVar5;
      iVar2 = Stream::readI32(stream);
      *(void **)((long)data + -0x1c) = (void *)((long)pvVar1 + (long)(iVar2 / 0x24) * 0x28);
      lVar3 = lVar3 + 1;
      data = (void *)((long)data + 0x28);
    } while (lVar3 < pAVar4->numFrames);
  }
  return pAVar4;
}

Assistant:

Animation*
Animation::streamReadLegacy(Stream *stream)
{
	Animation *anim;
	AnimInterpolatorInfo *interpInfo = AnimInterpolatorInfo::find(1);
	int32 numFrames = stream->readI32();
	int32 flags = stream->readI32();
	float duration = stream->readF32();
	anim = Animation::create(interpInfo, numFrames, flags, duration);
	HAnimKeyFrame *frames = (HAnimKeyFrame*)anim->keyframes;
	for(int32 i = 0; i < anim->numFrames; i++){
		stream->read32(&frames[i].q, 4*4);
		frames[i].q = conj(frames[i].q);
		stream->read32(&frames[i].t, 3*4);
		frames[i].time = stream->readF32();
		int32 prev = stream->readI32()/0x24;
		frames[i].prev = &frames[prev];
	}
	return anim;
}